

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O3

void pnga_scale_patch(Integer g_a,Integer *lo,Integer *hi,void *alpha)

{
  undefined1 auVar1 [16];
  double dVar2;
  char *pcVar3;
  int iVar4;
  logical lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long ndim_00;
  Integer IVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  char *src_data_ptr;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_558;
  undefined8 uStack_550;
  long local_548 [8];
  Integer *local_508;
  Integer *local_500;
  Integer local_4f8;
  long local_4f0 [9];
  undefined8 local_4a8;
  long lStack_4a0;
  undefined1 local_498 [48];
  long local_468 [8];
  long alStack_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_508 = lo;
  local_500 = hi;
  pnga_nodeid();
  bVar14 = _ga_sync_begin != 0;
  uStack_550._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar14) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_4f8,local_4f0,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar4 = pnga_local_iterator_next(&local_330,local_548,local_4f0 + 1,&local_558,local_3e8);
  ndim_00 = local_4f0[0];
  do {
    if (iVar4 == 0) {
      if (uStack_550._4_4_ != 0) {
        pnga_sync();
      }
      return;
    }
    local_4f0[0] = ndim_00;
    if (ndim_00 < 1) {
      lVar5 = pnga_patch_intersect(local_508,local_500,local_548,local_4f0 + 1,ndim_00);
      IVar13 = local_4f8;
      if (lVar5 != 0) {
LAB_001194d8:
        pcVar3 = local_558;
        lVar6 = 1;
        if (1 < ndim_00) {
          lVar7 = 1;
          do {
            lVar6 = lVar6 * ((local_4f0[lVar7 + 1] - local_548[lVar7]) + 1);
            lVar7 = lVar7 + 1;
          } while (ndim_00 != lVar7);
        }
        local_4a8 = 0;
        lStack_4a0 = 0;
        alStack_428[1] = 1;
        local_468[0] = local_3e8[0];
        lVar7 = local_3e8[0] * local_3e8[1];
        local_468[1] = lVar7;
        if (2 < ndim_00) {
          memset(local_498,0,ndim_00 * 8 - 0x10);
          lVar8 = 2;
          lVar10 = 1;
          do {
            lVar10 = lVar10 * ((local_4f0[lVar8] - (&uStack_550)[lVar8]) + 1);
            lVar7 = lVar7 * local_3e8[lVar8];
            alStack_428[lVar8] = lVar10;
            local_468[lVar8] = lVar7;
            lVar8 = lVar8 + 1;
          } while (ndim_00 != lVar8);
        }
        switch(IVar13) {
        case 0x3e9:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = 0;
                do {
                  *(int *)(pcVar3 + lVar10 * 4 + lVar8 * 4) =
                       *(int *)(pcVar3 + lVar10 * 4 + lVar8 * 4) * *alpha;
                  lVar10 = lVar10 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar10);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        case 0x3ea:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = -1;
                do {
                  *(long *)(pcVar3 + lVar10 * 8 + lVar8 * 8 + 8) =
                       *(long *)(pcVar3 + lVar10 * 8 + lVar8 * 8 + 8) * *alpha;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < local_4f0[1] - local_548[0]);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        case 0x3eb:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = 0;
                do {
                  *(float *)(pcVar3 + lVar10 * 4 + lVar8 * 4) =
                       *alpha * *(float *)(pcVar3 + lVar10 * 4 + lVar8 * 4);
                  lVar10 = lVar10 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar10);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        case 0x3ec:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = 0;
                do {
                  *(double *)(pcVar3 + lVar10 * 8 + lVar8 * 8) =
                       *alpha * *(double *)(pcVar3 + lVar10 * 8 + lVar8 * 8);
                  lVar10 = lVar10 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar10);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        default:
          pnga_error(" wrong data type ",IVar13);
          break;
        case 0x3ee:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = 0;
                do {
                  fVar15 = (float)*alpha;
                  fVar16 = (float)((ulong)*alpha >> 0x20);
                  *(ulong *)(pcVar3 + lVar10 * 8 + lVar8 * 8) =
                       CONCAT44(*(float *)(pcVar3 + lVar10 * 8 + lVar8 * 8) * fVar16 +
                                fVar15 * *(float *)(pcVar3 + lVar10 * 8 + lVar8 * 8 + 4),
                                *(float *)(pcVar3 + lVar10 * 8 + lVar8 * 8) * fVar15 +
                                fVar16 * -*(float *)(pcVar3 + lVar10 * 8 + lVar8 * 8 + 4));
                  lVar10 = lVar10 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar10);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        case 0x3ef:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                pauVar12 = (undefined1 (*) [16])(pcVar3 + lVar8 * 0x10);
                lVar8 = (local_4f0[1] - local_548[0]) + 1;
                do {
                  dVar2 = *(double *)*pauVar12 * *(double *)((long)alpha + 8) +
                          *alpha * *(double *)(*pauVar12 + 8);
                  auVar1._8_4_ = SUB84(dVar2,0);
                  auVar1._0_8_ = *(double *)*pauVar12 * *alpha +
                                 *(double *)((long)alpha + 8) * -*(double *)(*pauVar12 + 8);
                  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
                  *pauVar12 = auVar1;
                  pauVar12 = pauVar12 + 1;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
          break;
        case 0x3f8:
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if (ndim_00 < 2) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar8 = lVar8 + local_468[lVar10] * *(long *)(local_498 + lVar10 * 8 + -8);
                  lVar11 = *(long *)(local_498 + lVar10 * 8 + -8) +
                           (ulong)((lVar7 + 1) % alStack_428[lVar10 + 1] == 0);
                  lVar9 = 0;
                  if (lVar11 <= local_4f0[lVar10 + 2] - local_548[lVar10 + 1]) {
                    lVar9 = lVar11;
                  }
                  *(long *)(local_498 + lVar10 * 8 + -8) = lVar9;
                  lVar10 = lVar10 + 1;
                } while (ndim_00 + -1 != lVar10);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar10 = 0;
                do {
                  *(long *)(pcVar3 + lVar10 * 8 + lVar8 * 8) =
                       *(long *)(pcVar3 + lVar10 * 8 + lVar8 * 8) * *alpha;
                  lVar10 = lVar10 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar10);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar6);
          }
        }
      }
    }
    else {
      memcpy(alStack_3b0 + 1,local_548,ndim_00 * 8);
      lVar5 = pnga_patch_intersect(local_508,local_500,local_548,local_4f0 + 1,ndim_00);
      if (lVar5 != 0) {
        lVar6 = 0;
LAB_00119491:
        IVar13 = local_4f8;
        if (local_548[lVar6] <= alStack_3b0[lVar6 + 1]) break;
        if (ndim_00 == 1) {
          lVar6 = 1;
          lVar7 = 0;
        }
        else {
          lVar6 = 1;
          lVar8 = 0;
          lVar7 = 0;
          do {
            lVar7 = lVar7 + (local_548[lVar8] - alStack_3b0[lVar8 + 1]) * lVar6;
            lVar6 = lVar6 * local_3e8[lVar8];
            lVar8 = lVar8 + 1;
          } while (ndim_00 + -1 != lVar8);
        }
        if (0xf < local_4f8 - 0x3e9U) {
switchD_001196f5_caseD_3ed:
          pnga_error(" wrong data type ",local_4f8);
          ndim_00 = local_4f0[0];
          IVar13 = local_4f8;
          goto LAB_001194d8;
        }
        lVar7 = ((&uStack_550)[ndim_00] - alStack_3b0[ndim_00]) * lVar6 + lVar7;
        switch(local_4f8) {
        case 0x3e9:
          local_558 = local_558 + lVar7 * 4;
          IVar13 = 0x3e9;
          break;
        case 0x3ea:
          local_558 = local_558 + lVar7 * 8;
          IVar13 = 0x3ea;
          break;
        case 0x3eb:
          local_558 = local_558 + lVar7 * 4;
          IVar13 = 0x3eb;
          break;
        case 0x3ec:
          local_558 = local_558 + lVar7 * 8;
          IVar13 = 0x3ec;
          break;
        default:
          goto switchD_001196f5_caseD_3ed;
        case 0x3ee:
          lVar7 = lVar7 * 8;
          goto LAB_00119c80;
        case 0x3ef:
          lVar7 = lVar7 * 0x10;
LAB_00119c80:
          local_558 = local_558 + lVar7;
          break;
        case 0x3f8:
          local_558 = local_558 + lVar7 * 8;
          IVar13 = 0x3f8;
        }
        goto LAB_001194d8;
      }
    }
    iVar4 = pnga_local_iterator_next(&local_330,local_548,local_4f0 + 1,&local_558,local_3e8);
    ndim_00 = local_4f0[0];
  } while( true );
  lVar6 = lVar6 + 1;
  if (ndim_00 == lVar6) goto LAB_001194d8;
  goto LAB_00119491;
}

Assistant:

void pnga_scale_patch(Integer g_a, Integer *lo, Integer *hi, void *alpha)
{
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM];
  Integer ld[MAXDIM];
  char *src_data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&src_data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            src_data_ptr = (void*)((int*)src_data_ptr + offset);
            break;
          case C_DCPL:
            src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
            break;
          case C_SCPL:
            src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
            break;
          case C_DBL:
            src_data_ptr = (void*)((double*)src_data_ptr + offset);
            break;
          case C_FLOAT:
            src_data_ptr = (void*)((float*)src_data_ptr + offset);
            break;     
          case C_LONG:
            src_data_ptr = (void*)((long*)src_data_ptr + offset);
            break;                          
          case C_LONGLONG:
            src_data_ptr = (void*)((long long*)src_data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);
    }

  }
#else
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, loA, hiA);

    /* determine subset of my patch to access */
    if (pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      pnga_access_ptr(g_a, loA, hiA, &src_data_ptr, ld);

      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA); 
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of VISIBLE patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get src_data_ptr to corner of patch */
          /* ld are leading dimensions INCLUDING ghost cells */
          pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();   
}